

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkUnitTest.cpp
# Opt level: O2

bool tonk::TestReadFooterField(void)

{
  return true;
}

Assistant:

bool TestReadFooterField()
{
    uint8_t footer[8] = {
        0, 1, 2, 3, /* read behind here */ 4, 5, 6, 7
    };

    {
        uint32_t x = protocol::ReadFooterField(footer + 4, 0);
        if (x != 0)
        {
            TONK_DEBUG_BREAK();
            return false;
        }
    }
    {
        uint32_t x = protocol::ReadFooterField(footer + 4, 1);
        if (x != 0x03)
        {
            TONK_DEBUG_BREAK();
            return false;
        }
    }
    {
        uint32_t x = protocol::ReadFooterField(footer + 4, 2);
        if (x != 0x0302)
        {
            TONK_DEBUG_BREAK();
            return false;
        }
        if (x != *(uint16_t*)(footer + 4 - 2))
        {
            TONK_DEBUG_BREAK();
            return false;
        }
    }
    {
        uint32_t x = protocol::ReadFooterField(footer + 4, 3);
        if (x != 0x030201)
        {
            TONK_DEBUG_BREAK();
            return false;
        }
    }

    {
        protocol::WriteFooterField(footer + 4, 0, 0);
        uint32_t x = protocol::ReadFooterField(footer + 4, 0);
        if (x != 0)
        {
            TONK_DEBUG_BREAK();
            return false;
        }
    }
    {
        const uint32_t value = 0x67;
        const uint32_t bytes = 1;
        protocol::WriteFooterField(footer + 4, value, bytes);
        uint32_t x = protocol::ReadFooterField(footer + 4 + bytes, bytes);
        if (x != value)
        {
            TONK_DEBUG_BREAK();
            return false;
        }
    }
    {
        const uint32_t value = 0x4567;
        const uint32_t bytes = 2;
        protocol::WriteFooterField(footer + 4, value, bytes);
        uint32_t x = protocol::ReadFooterField(footer + 4 + bytes, bytes);
        if (x != value)
        {
            TONK_DEBUG_BREAK();
            return false;
        }
    }
    {
        const uint32_t value = 0x234567;
        const uint32_t bytes = 3;
        protocol::WriteFooterField(footer + 4, value, bytes);
        uint32_t x = protocol::ReadFooterField(footer + 4 + bytes, bytes);
        if (x != value)
        {
            TONK_DEBUG_BREAK();
            return false;
        }
    }

    return true;
}